

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cc
# Opt level: O1

shared_ptr<event> event::parse(char *buf,size_t buf_len,bool require_exact_size)

{
  uint *destination;
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined **ppuVar5;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  size_t len_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  shared_ptr<event> sVar8;
  uint8_t *pointer;
  uint32_t event_no;
  uint32_t len;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  uint local_38;
  uint local_34;
  
  len_00 = CONCAT71(in_register_00000011,require_exact_size);
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)buf_len;
  bVar2 = anon_unknown.dwarf_21406::consume_bytes<unsigned_int>
                    ((uint8_t *)buf_len,len_00,(uint8_t **)&local_40,&local_34);
  _Var6._M_pi = extraout_RDX;
  if (!bVar2) {
LAB_00105b4c:
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    goto LAB_00105b52;
  }
  if ((len_00 != 0) &&
     ((local_40 < buf_len ||
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(buf_len + len_00) <= local_40)))) {
    __assert_fail("len == 0 || (pointer >= stream && pointer < stream + len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Xanewok[P]netacka-clone/protocol.cc"
                  ,0x2e,
                  "bool (anonymous namespace)::consume_bytes(const std::uint8_t *, size_t, const std::uint8_t *&, T &) [T = unsigned char]"
                 );
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&local_40->_vptr__Sp_counted_base + 1);
  _Var6._M_pi = local_40;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(buf_len + len_00) < p_Var7)
  goto LAB_00105b4c;
  uVar1 = *(undefined1 *)&local_40->_vptr__Sp_counted_base;
  local_40 = p_Var7;
  bVar2 = anon_unknown.dwarf_21406::consume_bytes<unsigned_int>
                    ((uint8_t *)buf_len,len_00,(uint8_t **)&local_40,&local_38);
  _Var6._M_pi = extraout_RDX_00;
  if (!bVar2) goto LAB_00105b4c;
  switch(uVar1) {
  case 0:
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010cc00;
    p_Var7 = this + 1;
    *(undefined1 *)&this[1]._M_weak_count = 0;
    this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__new_game_0010ca90;
    this[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    this[3]._M_use_count = 0;
    this[3]._M_weak_count = 0;
    this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    _Var6._M_pi = extraout_RDX_01;
    goto LAB_00105c20;
  case 1:
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010cd00;
    p_Var7 = this + 1;
    *(undefined1 *)&this[1]._M_weak_count = 1;
    ppuVar5 = &PTR__event_0010cad0;
    _Var6._M_pi = extraout_RDX_04;
    break;
  case 2:
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010ccb0;
    p_Var7 = this + 1;
    *(undefined1 *)&this[1]._M_weak_count = 2;
    ppuVar5 = &PTR__event_0010cb10;
    _Var6._M_pi = extraout_RDX_02;
    break;
  case 3:
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010cd50;
    p_Var7 = this + 1;
    *(undefined1 *)&this[1]._M_weak_count = 3;
    ppuVar5 = &PTR__event_0010cb50;
    _Var6._M_pi = extraout_RDX_03;
    break;
  default:
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_00105c20;
  }
  this[1]._vptr__Sp_counted_base = (_func_int **)ppuVar5;
LAB_00105c20:
  if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00105c92:
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
  }
  else {
    p_Var7->_M_use_count = local_34;
    *(uint *)&p_Var7[1]._vptr__Sp_counted_base = local_38;
    iVar3 = (*p_Var7->_vptr__Sp_counted_base[5])(p_Var7,local_40,(ulong)local_34 - 5);
    local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar3);
    _Var6._M_pi = extraout_RDX_05;
    if (local_40 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00105c92;
    destination = (uint *)((long)&p_Var7[1]._vptr__Sp_counted_base + 4);
    bVar2 = anon_unknown.dwarf_21406::consume_bytes<unsigned_int>
                      ((uint8_t *)buf_len,len_00,(uint8_t **)&local_40,destination);
    _Var6._M_pi = extraout_RDX_06;
    if (!bVar2) goto LAB_00105c92;
    uVar4 = xcrc32((uchar *)buf_len,((int)local_40 - (int)buf_len) + -4,0);
    if (uVar4 == *destination) {
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)buf = p_Var7;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(buf + 8) = this;
      this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var6._M_pi = extraout_RDX_07;
    }
    else {
      parse((event *)buf);
      _Var6._M_pi = extraout_RDX_09;
    }
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    _Var6._M_pi = extraout_RDX_08;
  }
LAB_00105b52:
  sVar8.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar8.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)buf;
  return (shared_ptr<event>)sVar8.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<event> event::parse(const char* buf, size_t buf_len, bool require_exact_size/* = false*/)
{
	const std::uint8_t* stream = reinterpret_cast<const std::uint8_t*>(buf);
	const std::uint8_t* pointer = stream;

	std::uint32_t len;
	if (!consume_bytes(stream, buf_len, pointer, len))
		return nullptr;

	std::uint8_t event_type;
	if (!consume_bytes(stream, buf_len, pointer, event_type))
		return nullptr;

	std::uint32_t event_no;
	if (!consume_bytes(stream, buf_len, pointer, event_no))
		return nullptr;

	auto event = create_event(static_cast<event_type_t>(event_type));
	// Parsed event type is invalid or couldn't create event
	if (event == nullptr)
		return nullptr;
	
	event->len = len;
	event->event_no = event_no;

	pointer = event->parse_event_data(pointer, len - sizeof(event::event_no) - sizeof(event::event_type));
	// Could not succesfully parse event_data depending on event type
	if (pointer == nullptr)
		return nullptr;

	if (!consume_bytes(stream, buf_len, pointer, event->crc32))
		return nullptr;

	// Reported message length and parsed len do not match
	//if (require_exact_size && len != (pointer - stream) - sizeof(event::crc32) - sizeof(event::len))
	//	return nullptr;

	// CRC checksum mismatch
	auto crc = xcrc32(stream, (pointer - sizeof(event::crc32)) - stream, 0);
	if (crc != event->crc32) {
		fprintf(stderr, "CRC checksum mismatch\n");
		return nullptr;
	}

	// Data was exact, event could be created and crc matches - we're good to go
	return event;
}